

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int validate_typed_array(JSContext *ctx,JSValue this_val)

{
  JSObject *pJVar1;
  
  pJVar1 = get_typed_array(ctx,this_val,0);
  if (pJVar1 != (JSObject *)0x0) {
    if (*(char *)((long)&((((pJVar1->u).map_iterator_data)->cur_record->hash_link).next)->prev + 4)
        == '\0') {
      return 0;
    }
    JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
  }
  return -1;
}

Assistant:

static int validate_typed_array(JSContext *ctx, JSValueConst this_val)
{
    JSObject *p;
    p = get_typed_array(ctx, this_val, 0);
    if (!p)
        return -1;
    if (typed_array_is_detached(ctx, p)) {
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        return -1;
    }
    return 0;
}